

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

uint8_t __thiscall wasm::WasmBinaryReader::getLaneIndex(WasmBinaryReader *this,size_t lanes)

{
  allocator<char> local_41;
  string local_40;
  byte local_19;
  size_t sStack_18;
  uint8_t ret;
  size_t lanes_local;
  WasmBinaryReader *this_local;
  
  sStack_18 = lanes;
  lanes_local = (size_t)this;
  local_19 = getInt8(this);
  if (sStack_18 <= local_19) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Illegal lane index",&local_41);
    throwError(this,&local_40);
  }
  return local_19;
}

Assistant:

uint8_t WasmBinaryReader::getLaneIndex(size_t lanes) {
  auto ret = getInt8();
  if (ret >= lanes) {
    throwError("Illegal lane index");
  }
  return ret;
}